

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O2

int __thiscall lsim::Simulator::init(Simulator *this,EVP_PKEY_CTX *ctx)

{
  pointer pVVar1;
  pointer puVar2;
  pointer pNVar3;
  pointer puVar4;
  pointer ppSVar5;
  pointer pVVar6;
  pointer puVar7;
  NodeMetadata *meta;
  pointer pNVar8;
  pointer puVar9;
  pointer ppSVar10;
  uint local_1c;
  
  this->m_time = 1;
  pVVar1 = (this->m_node_values_read).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pVVar6 = (this->m_node_values_read).
                super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
                super__Vector_impl_data._M_start; pVVar6 != pVVar1; pVVar6 = pVVar6 + 1) {
    *pVVar6 = VALUE_FALSE;
  }
  pVVar1 = (this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pVVar6 = (this->m_node_values_write).
                super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
                super__Vector_impl_data._M_start; pVVar6 != pVVar1; pVVar6 = pVVar6 + 1) {
    *pVVar6 = VALUE_FALSE;
  }
  puVar2 = (this->m_node_write_time).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar7 = (this->m_node_write_time).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1) {
    *puVar7 = 0;
  }
  puVar2 = (this->m_node_change_time).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar7 = (this->m_node_change_time).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1) {
    *puVar7 = 0;
  }
  puVar2 = (this->m_input_changed).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (this->m_input_changed).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1) {
    *puVar7 = 0;
  }
  pNVar3 = (this->m_node_metadata).
           super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pNVar8 = (this->m_node_metadata).
                super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl.
                super__Vector_impl_data._M_start; pNVar8 != pNVar3; pNVar8 = pNVar8 + 1) {
    pNVar8->m_default = VALUE_UNDEFINED;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear(&(pNVar8->m_active_pins)._M_t);
    pNVar8->m_time_dirty_write = 0;
  }
  puVar4 = (this->m_components).
           super__Vector_base<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (this->m_components).
                super__Vector_base<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar4; puVar9 = puVar9 + 1) {
    SimComponent::apply_initial_values
              ((puVar9->_M_t).
               super___uniq_ptr_impl<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>.
               _M_t.
               super__Tuple_impl<0UL,_lsim::SimComponent_*,_std::default_delete<lsim::SimComponent>_>
               .super__Head_base<0UL,_lsim::SimComponent_*,_false>._M_head_impl);
  }
  ppSVar5 = (this->m_init_components).
            super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar10 = (this->m_init_components).
                  super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppSVar10 != ppSVar5;
      ppSVar10 = ppSVar10 + 1) {
    std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>::operator()
              ((this->m_sim_functions).
               super__Vector_base<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>,_std::allocator<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(*ppSVar10)->m_comp_desc->m_type]._M_elems,
               this,*ppSVar10);
  }
  for (local_1c = 0;
      (ulong)local_1c <
      (ulong)((long)(this->m_node_values_read).
                    super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_node_values_read).
                    super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2); local_1c = local_1c + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_dirty_nodes_read,&local_1c);
  }
  return local_1c;
}

Assistant:

void Simulator::init() {
    m_time = 1;

    std::fill(std::begin(m_node_values_read), std::end(m_node_values_read), VALUE_FALSE);
    std::fill(std::begin(m_node_values_write), std::end(m_node_values_write), VALUE_FALSE);
    std::fill(std::begin(m_node_write_time), std::end(m_node_write_time), 0);
    std::fill(std::begin(m_node_change_time), std::end(m_node_change_time), 0);
	std::fill(std::begin(m_input_changed), std::end(m_input_changed), 0);

    for (auto &meta : m_node_metadata) {
        meta.m_default = VALUE_UNDEFINED;
		meta.m_active_pins.clear();
		meta.m_time_dirty_write = 0;
    }

    // apply initial values
    for (auto &comp : m_components) {
		comp->apply_initial_values();
    }

    // run one time setup functions
    for (auto comp : m_init_components) {
        auto &setup_func = m_sim_functions[comp->description()->type()][SIM_FUNCTION_SETUP];
        setup_func(this, comp);
    }

    // mark all nodes as dirty for the first run
    for (node_t node = 0; node < m_node_values_read.size(); ++node) {
        m_dirty_nodes_read.push_back(node);
    }
}